

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O3

void Fra_OneHotCheck(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  
  iVar7 = vOneHots->nSize;
  if (0 < iVar7) {
    iVar9 = p->pManFraig->nObjs[3] - p->pManFraig->nRegs;
    lVar11 = 0;
    do {
      if ((long)iVar7 <= lVar11 + 1) goto LAB_005d25b5;
      uVar1 = vOneHots->pArray[lVar11];
      uVar2 = vOneHots->pArray[lVar11 + 1];
      if (uVar1 != 0 || uVar2 != 0) {
        uVar6 = ~uVar1;
        if (0 < (int)uVar1) {
          uVar6 = uVar1 - 1;
        }
        uVar6 = uVar6 + iVar9;
        if ((int)uVar6 < 0) {
LAB_005d2596:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pVVar4 = p->pManFraig->vCos;
        uVar3 = pVVar4->nSize;
        if ((int)uVar3 <= (int)uVar6) goto LAB_005d2596;
        uVar10 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar10 = uVar2 - 1;
        }
        uVar10 = uVar10 + iVar9;
        if (((int)uVar10 < 0) || (uVar3 <= uVar10)) goto LAB_005d2596;
        ppvVar5 = pVVar4->pArray;
        iVar7 = Fra_NodesAreClause(p,(Aig_Obj_t *)ppvVar5[uVar6],(Aig_Obj_t *)ppvVar5[uVar10],
                                   uVar1 >> 0x1f,uVar2 >> 0x1f);
        if (iVar7 == 1) {
          iVar7 = vOneHots->nSize;
        }
        else {
          p->pCla->fRefinement = 1;
          if (iVar7 == 0) {
            Fra_SmlResimulate(p);
          }
          iVar7 = vOneHots->nSize;
          lVar8 = (long)iVar7;
          if (lVar8 <= lVar11) {
LAB_005d25b5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (vOneHots->pArray[lVar11] != 0) {
            puts("Fra_OneHotCheck(): Clause is not refined!");
            iVar7 = vOneHots->nSize;
            lVar8 = (long)iVar7;
          }
          if (lVar8 <= lVar11) goto LAB_005d25b5;
          if (vOneHots->pArray[lVar11] != 0) {
            __assert_fail("Vec_IntEntry(vOneHots, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraHot.c"
                          ,0xfa,"void Fra_OneHotCheck(Fra_Man_t *, Vec_Int_t *)");
          }
        }
      }
      lVar11 = lVar11 + 2;
    } while ((int)lVar11 < iVar7);
  }
  return;
}

Assistant:

void Fra_OneHotCheck( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int RetValue, i, Out1, Out2;
    int nTruePos = Aig_ManCoNum(p->pManFraig) - Aig_ManRegNum(p->pManFraig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out2) );
        RetValue = Fra_NodesAreClause( p, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vOneHots, i) != 0 )
                printf( "Fra_OneHotCheck(): Clause is not refined!\n" );
            assert( Vec_IntEntry(vOneHots, i) == 0 );
        }
    }
}